

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.h
# Opt level: O0

void __thiscall
rpn::RPNExpression::Push<rpn::QuotedArgExpression,unsigned_long&>
          (RPNExpression *this,unsigned_long *args)

{
  unique_ptr<rpn::QuotedArgExpression,_std::default_delete<rpn::QuotedArgExpression>_> local_28;
  unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_> local_20;
  unsigned_long *local_18;
  unsigned_long *args_local;
  RPNExpression *this_local;
  
  local_18 = args;
  args_local = (unsigned_long *)this;
  std::make_unique<rpn::QuotedArgExpression,unsigned_long&>((unsigned_long *)&local_28);
  std::unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>>::
  unique_ptr<rpn::QuotedArgExpression,std::default_delete<rpn::QuotedArgExpression>,void>
            ((unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>> *)&local_20,
             &local_28);
  Push(this,(expression_ptr *)&local_20);
  std::unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_>::~unique_ptr(&local_20);
  std::unique_ptr<rpn::QuotedArgExpression,_std::default_delete<rpn::QuotedArgExpression>_>::
  ~unique_ptr(&local_28);
  return;
}

Assistant:

void Push(ExprArgs&&... args)
    {
        Push(std::make_unique<ExprT>(std::forward<ExprArgs>(args)...));
    }